

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O2

void __thiscall
TimedMutexTest_TryLockForTimeout_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
::TimedMutexTest_TryLockForTimeout_Test
          (TimedMutexTest_TryLockForTimeout_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
           *this)

{
  TimedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>::TimedMutexTest
            (&this->
              super_TimedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
            );
  (this->super_TimedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__Test_00273748;
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockForTimeout)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    yamc::test::stopwatch<std::chrono::steady_clock> sw;
    EXPECT_FALSE(mtx.try_lock_for(TEST_EXPECT_TIMEOUT));
    EXPECT_LE(TEST_EXPECT_TIMEOUT, sw.elapsed());
    step.await();  // b2
  }
}